

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurveOnSurface.h
# Opt level: O0

Index __thiscall
anurbs::
CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
::degree(CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
         *this)

{
  initializer_list<long> __l;
  int iVar1;
  element_type *peVar2;
  undefined4 extraout_var;
  element_type *peVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar4;
  long local_38;
  undefined8 local_30;
  undefined8 local_28;
  iterator local_20;
  undefined8 local_18;
  CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
  *local_10;
  CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
  *this_local;
  
  local_10 = this;
  peVar2 = std::
           __shared_ptr_access<anurbs::NurbsCurveGeometry<2L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<anurbs::NurbsCurveGeometry<2L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_curve_geometry);
  iVar1 = (*(peVar2->super_CurveBase<2L>)._vptr_CurveBase[2])();
  local_38 = CONCAT44(extraout_var,iVar1);
  peVar3 = std::
           __shared_ptr_access<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_surface_geometry);
  iVar1 = (*(peVar3->super_SurfaceBase<3L>)._vptr_SurfaceBase[2])();
  local_30 = CONCAT44(extraout_var_00,iVar1);
  peVar3 = std::
           __shared_ptr_access<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_surface_geometry);
  iVar1 = (*(peVar3->super_SurfaceBase<3L>)._vptr_SurfaceBase[3])();
  local_28 = CONCAT44(extraout_var_01,iVar1);
  local_20 = &local_38;
  local_18 = 3;
  __l._M_len = 3;
  __l._M_array = local_20;
  lVar4 = std::max<long>(__l);
  return lVar4;
}

Assistant:

Index degree() const override
    {
        return std::max({m_curve_geometry->degree(),
            m_surface_geometry->degree_u(), m_surface_geometry->degree_v()});
    }